

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::WindowExpression::Deserialize(WindowExpression *this,Deserializer *deserializer)

{
  ExpressionType type;
  WindowExpression *this_00;
  pointer pWVar1;
  _Head_base<0UL,_duckdb::WindowExpression_*,_false> local_20;
  
  this_00 = (WindowExpression *)operator_new(0x128);
  type = SerializationData::Get<duckdb::ExpressionType>(&deserializer->data);
  WindowExpression(this_00,type);
  local_20._M_head_impl = this_00;
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"function_name",&pWVar1->function_name);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xc9,"schema",&pWVar1->schema);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xca,"catalog",&pWVar1->catalog);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,0xcb,"children",&pWVar1->children);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,0xcc,"partitions",&pWVar1->partitions);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (deserializer,0xcd,"orders",&pWVar1->orders);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::WindowBoundary>(deserializer,0xce,"start",&pWVar1->start);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::WindowBoundary>(deserializer,0xcf,"end",&pWVar1->end);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xd0,"start_expr",&pWVar1->start_expr);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xd1,"end_expr",&pWVar1->end_expr);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xd2,"offset_expr",&pWVar1->offset_expr);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xd3,"default_expr",&pWVar1->default_expr);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xd4,"ignore_nulls",&pWVar1->ignore_nulls);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xd5,"filter_expr",&pWVar1->filter_expr);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::WindowExcludeMode>
            (deserializer,0xd6,"exclude_clause",&pWVar1->exclude_clause,NO_OTHER);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xd7,"distinct",&pWVar1->distinct);
  pWVar1 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (deserializer,0xd8,"arg_orders",&pWVar1->arg_orders);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> WindowExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<WindowExpression>(new WindowExpression(deserializer.Get<ExpressionType>()));
	deserializer.ReadPropertyWithDefault<string>(200, "function_name", result->function_name);
	deserializer.ReadPropertyWithDefault<string>(201, "schema", result->schema);
	deserializer.ReadPropertyWithDefault<string>(202, "catalog", result->catalog);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(203, "children", result->children);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(204, "partitions", result->partitions);
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(205, "orders", result->orders);
	deserializer.ReadProperty<WindowBoundary>(206, "start", result->start);
	deserializer.ReadProperty<WindowBoundary>(207, "end", result->end);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(208, "start_expr", result->start_expr);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(209, "end_expr", result->end_expr);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(210, "offset_expr", result->offset_expr);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(211, "default_expr", result->default_expr);
	deserializer.ReadPropertyWithDefault<bool>(212, "ignore_nulls", result->ignore_nulls);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(213, "filter_expr", result->filter_expr);
	deserializer.ReadPropertyWithExplicitDefault<WindowExcludeMode>(214, "exclude_clause", result->exclude_clause, WindowExcludeMode::NO_OTHER);
	deserializer.ReadPropertyWithDefault<bool>(215, "distinct", result->distinct);
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(216, "arg_orders", result->arg_orders);
	return std::move(result);
}